

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcv.c
# Opt level: O2

size_t tcv_get_user_writable_eeprom_size(tcv_t *tcv)

{
  _func_size_t_tcv_t_ptr *p_Var1;
  _Bool _Var2;
  size_t sVar3;
  
  _Var2 = tcv_check_and_lock_ok(tcv);
  if (_Var2) {
    p_Var1 = tcv->fun->get_user_writable_eeprom_size;
    if (p_Var1 == (_func_size_t_tcv_t_ptr *)0x0) {
      sVar3 = 0;
    }
    else {
      sVar3 = (*p_Var1)(tcv);
      sVar3 = (size_t)(int)sVar3;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&tcv->lock);
  }
  else {
    sVar3 = 0;
  }
  return sVar3;
}

Assistant:

size_t tcv_get_user_writable_eeprom_size(tcv_t *tcv)
{
	int ret = 0;

	if (!tcv_check_and_lock_ok(tcv))
		return 0;

	if (tcv->fun->get_user_writable_eeprom_size)
		ret = tcv->fun->get_user_writable_eeprom_size(tcv);

	tcv_unlock(tcv);
	return ret;
}